

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O2

void rw::registerNativeDataPlugin(void)

{
  Geometry::registerPlugin(0,0x510,(Constructor)0x0,destroyNativeData,(CopyConstructor)0x0);
  Geometry::registerPluginStream(0x510,readNativeData,writeNativeData,getSizeNativeData);
  return;
}

Assistant:

void
registerNativeDataPlugin(void)
{
	Geometry::registerPlugin(0, ID_NATIVEDATA,
	                         nil, destroyNativeData, nil);
	Geometry::registerPluginStream(ID_NATIVEDATA,
	                               readNativeData,
	                               writeNativeData,
	                               getSizeNativeData);
}